

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  long *plVar1;
  bool bVar2;
  WindowStateChangedEvent *this;
  
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
                      (args,args_1,args_2);
    return bVar2;
  }
  this = (WindowStateChangedEvent *)operator_new(0x30);
  QWindowSystemInterfacePrivate::WindowStateChangedEvent::WindowStateChangedEvent
            (this,args,
             (WindowStates)
             args_1.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i,
             (WindowStates)
             args_2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i);
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}